

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deFile.c
# Opt level: O1

deFileResult deFile_read(deFile *file,void *buf,deInt64 bufSize,deInt64 *numReadPtr)

{
  deFileResult dVar1;
  ssize_t sVar2;
  int *piVar3;
  
  sVar2 = read(file->fd,buf,bufSize);
  if (numReadPtr != (deInt64 *)0x0) {
    *numReadPtr = sVar2;
  }
  dVar1 = DE_FILERESULT_SUCCESS;
  if (sVar2 < 1) {
    if (sVar2 == 0) {
      dVar1 = DE_FILERESULT_END_OF_FILE;
    }
    else {
      piVar3 = __errno_location();
      dVar1 = *piVar3 == 0xb ^ DE_FILERESULT_ERROR;
    }
  }
  return dVar1;
}

Assistant:

deFileResult deFile_read (deFile* file, void* buf, deInt64 bufSize, deInt64* numReadPtr)
{
	deInt64 numRead = read(file->fd, buf, (size_t)bufSize);

	if (numReadPtr)
		*numReadPtr = numRead;

	return mapReadWriteResult(numRead);
}